

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_handle_lifetime.cpp
# Opt level: O0

ze_result_t __thiscall
validation_layer::ZETHandleLifetimeValidation::zetMetricTracerCreateExpPrologue
          (ZETHandleLifetimeValidation *this,zet_context_handle_t hContext,
          zet_device_handle_t hDevice,uint32_t metricGroupCount,
          zet_metric_group_handle_t *phMetricGroups,zet_metric_tracer_exp_desc_t *desc,
          ze_event_handle_t hNotificationEvent,zet_metric_tracer_exp_handle_t *phMetricTracer)

{
  bool bVar1;
  pointer pHVar2;
  ulong local_48;
  size_t i;
  zet_metric_tracer_exp_desc_t *desc_local;
  zet_metric_group_handle_t *phMetricGroups_local;
  uint32_t metricGroupCount_local;
  zet_device_handle_t hDevice_local;
  zet_context_handle_t hContext_local;
  ZETHandleLifetimeValidation *this_local;
  
  pHVar2 = std::
           unique_ptr<validation_layer::HandleLifetimeValidation,_std::default_delete<validation_layer::HandleLifetimeValidation>_>
           ::operator->((unique_ptr<validation_layer::HandleLifetimeValidation,_std::default_delete<validation_layer::HandleLifetimeValidation>_>
                         *)(context + 0xd48));
  bVar1 = HandleLifetimeValidation::isHandleValid(pHVar2,hContext);
  if (bVar1) {
    pHVar2 = std::
             unique_ptr<validation_layer::HandleLifetimeValidation,_std::default_delete<validation_layer::HandleLifetimeValidation>_>
             ::operator->((unique_ptr<validation_layer::HandleLifetimeValidation,_std::default_delete<validation_layer::HandleLifetimeValidation>_>
                           *)(context + 0xd48));
    bVar1 = HandleLifetimeValidation::isHandleValid(pHVar2,hDevice);
    if (bVar1) {
      for (local_48 = 0;
          phMetricGroups != (zet_metric_group_handle_t *)0x0 && local_48 < metricGroupCount;
          local_48 = local_48 + 1) {
        pHVar2 = std::
                 unique_ptr<validation_layer::HandleLifetimeValidation,_std::default_delete<validation_layer::HandleLifetimeValidation>_>
                 ::operator->((unique_ptr<validation_layer::HandleLifetimeValidation,_std::default_delete<validation_layer::HandleLifetimeValidation>_>
                               *)(context + 0xd48));
        bVar1 = HandleLifetimeValidation::isHandleValid(pHVar2,phMetricGroups[local_48]);
        if (!bVar1) {
          return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
        }
      }
      if (hNotificationEvent != (ze_event_handle_t)0x0) {
        pHVar2 = std::
                 unique_ptr<validation_layer::HandleLifetimeValidation,_std::default_delete<validation_layer::HandleLifetimeValidation>_>
                 ::operator->((unique_ptr<validation_layer::HandleLifetimeValidation,_std::default_delete<validation_layer::HandleLifetimeValidation>_>
                               *)(context + 0xd48));
        bVar1 = HandleLifetimeValidation::isHandleValid(pHVar2,hNotificationEvent);
        if (!bVar1) {
          return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
        }
      }
      this_local._4_4_ = ZE_RESULT_SUCCESS;
    }
    else {
      this_local._4_4_ = ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
    }
  }
  else {
    this_local._4_4_ = ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
  }
  return this_local._4_4_;
}

Assistant:

ze_result_t
    ZETHandleLifetimeValidation::zetMetricTracerCreateExpPrologue(
        zet_context_handle_t hContext,                  ///< [in] handle of the context object
        zet_device_handle_t hDevice,                    ///< [in] handle of the device
        uint32_t metricGroupCount,                      ///< [in] metric group count
        zet_metric_group_handle_t* phMetricGroups,      ///< [in][range(0, metricGroupCount )] handles of the metric groups to
                                                        ///< trace
        zet_metric_tracer_exp_desc_t* desc,             ///< [in,out] metric tracer descriptor
        ze_event_handle_t hNotificationEvent,           ///< [in][optional] event used for report availability notification. Note:
                                                        ///< If buffer is not drained when the event it flagged, there is a risk of
                                                        ///< HW event buffer being overrun
        zet_metric_tracer_exp_handle_t* phMetricTracer  ///< [out] handle of the metric tracer
        )
    { 
        
        if ( !context.handleLifetime->isHandleValid( hContext )){
                return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
        }
        if ( !context.handleLifetime->isHandleValid( hDevice )){
                return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
        }
        for (size_t i = 0; ( nullptr != phMetricGroups) && (i < metricGroupCount ); ++i){
            if (!context.handleLifetime->isHandleValid( phMetricGroups[i] )){
                return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
            }
        }
        if (hNotificationEvent && !context.handleLifetime->isHandleValid( hNotificationEvent )){
                return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
        }
        return ZE_RESULT_SUCCESS;
    }